

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.hpp
# Opt level: O0

void __thiscall
diy::RegularPartners::RegularPartners<diy::RegularDecomposer<diy::Bounds<int>>>
          (RegularPartners *this,RegularDecomposer<diy::Bounds<int>_> *decomposer,int k,
          bool contiguous)

{
  byte in_CL;
  long in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  vector<int,_std::allocator<int>_> *in_stack_00000010;
  KVSVector *in_stack_00000060;
  DivisionVector *in_stack_00000068;
  int in_stack_00000074;
  RegularPartners *in_stack_00000090;
  
  std::vector<int,_std::allocator<int>_>::vector(in_stack_00000010,in_stack_00000008);
  std::vector<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_>::vector
            ((vector<diy::RegularPartners::DimK,_std::allocator<diy::RegularPartners::DimK>_> *)
             0x19685f);
  *(byte *)(in_RDI + 0x30) = in_CL & 1;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x19687b);
  factor(in_stack_00000074,in_stack_00000068,in_stack_00000060);
  fill_steps(in_stack_00000090);
  return;
}

Assistant:

RegularPartners(const Decomposer_& decomposer, int k, bool contiguous = true):
                  divisions_(decomposer.divisions),
                  contiguous_(contiguous)                       { factor(k, divisions_, kvs_); fill_steps(); }